

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

boolean rob_shop(monst *shkp)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  
  rouse_shk(shkp,'\x01');
  lVar4 = addupbill(shkp);
  lVar4 = *(int *)&shkp[0x1b].field_0x60 + lVar4;
  uVar1 = shkp[0x1b].mappearance;
  if ((int)uVar1 < lVar4) {
    pline("You escaped the shop without paying!");
    lVar4 = lVar4 - (int)shkp[0x1b].mappearance;
  }
  else {
    pcVar5 = currency((long)(int)uVar1);
    lVar4 = 0;
    pline("Your credit of %ld %s is used to cover your shopping bill.",(ulong)uVar1,pcVar5);
  }
  setpaid(shkp);
  if (lVar4 == 0) {
    bVar2 = '\0';
  }
  else {
    *(int *)&shkp[0x1b].mtame = *(int *)&shkp[0x1b].mtame + (int)lVar4;
    pcVar5 = currency(lVar4);
    pline("You stole %ld %s worth of merchandise.",lVar4,pcVar5);
    if (urole.malenum != 0x164) {
      iVar3 = sgn((int)u.ualign.type);
      adjalign(-iVar3);
    }
    hot_pursuit(shkp);
    bVar2 = '\x01';
  }
  return bVar2;
}

Assistant:

static boolean rob_shop(struct monst *shkp)
{
	struct eshk *eshkp;
	long total;

	eshkp = ESHK(shkp);
	rouse_shk(shkp, TRUE);
	total = (addupbill(shkp) + eshkp->debit);
	if (eshkp->credit >= total) {
	    pline("Your credit of %ld %s is used to cover your shopping bill.",
		 eshkp->credit, currency(eshkp->credit));
	    total = 0L;		/* credit gets cleared by setpaid() */
	} else {
	    pline("You escaped the shop without paying!");
	    total -= eshkp->credit;
	}
	setpaid(shkp);
	if (!total) return FALSE;

	/* by this point, we know an actual robbery has taken place */
	eshkp->robbed += total;
	pline("You stole %ld %s worth of merchandise.",
	    total, currency(total));
	if (!Role_if (PM_ROGUE))	/* stealing is unlawful */
	    adjalign(-sgn(u.ualign.type));

	hot_pursuit(shkp);
	return TRUE;
}